

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

void visit_listener_state_changed_floatv
               (void *userdata,ALCcontext *ctx,ALenum param,uint32 numfloats,ALfloat *values)

{
  char *pcVar1;
  char *pcVar2;
  uint local_2c;
  uint32 i;
  ALfloat *values_local;
  uint32 numfloats_local;
  ALenum param_local;
  ALCcontext *ctx_local;
  void *userdata_local;
  
  if (dump_state_changes != 0) {
    pcVar1 = ctxString(ctx);
    pcVar2 = alenumString(param);
    printf("<<< LISTENER STATE CHANGE: ctx=%s param=%s values={",pcVar1,pcVar2);
    for (local_2c = 0; local_2c < numfloats; local_2c = local_2c + 1) {
      pcVar1 = "";
      if (local_2c != 0) {
        pcVar1 = ",";
      }
      printf("%s %f",(double)values[local_2c],pcVar1);
    }
    pcVar1 = "";
    if (numfloats != 0) {
      pcVar1 = " ";
    }
    printf("%s} >>>\n",pcVar1);
  }
  return;
}

Assistant:

void visit_listener_state_changed_floatv(void *userdata, ALCcontext *ctx, const ALenum param, const uint32 numfloats, const ALfloat *values)
{
    if (dump_state_changes) {
        uint32 i;
        printf("<<< LISTENER STATE CHANGE: ctx=%s param=%s values={", ctxString(ctx), alenumString(param));
        for (i = 0; i < numfloats; i++) {
            printf("%s %f", i > 0 ? "," : "", values[i]);
        }
        printf("%s} >>>\n", numfloats > 0 ? " " : "");
    }
}